

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

bool __thiscall ninx::lexer::token::Text::is_empty(Text *this)

{
  int iVar1;
  long lVar2;
  string *s;
  Text *this_local;
  
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    this_local._7_1_ = true;
  }
  else if ((this->valid_newline & 1U) == 0) {
    if (is_empty()::emptyValidation == '\0') {
      iVar1 = __cxa_guard_acquire(&is_empty()::emptyValidation);
      if (iVar1 != 0) {
        boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
        basic_regex(&is_empty::emptyValidation,"^[\\s]+$",0);
        __cxa_atexit(boost::
                     basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                     ~basic_regex,&is_empty::emptyValidation,&__dso_handle);
        __cxa_guard_release(&is_empty()::emptyValidation);
      }
    }
    s = get_text_abi_cxx11_(this);
    this_local._7_1_ =
         boost::
         regex_match<std::char_traits<char>,std::allocator<char>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                   (s,&is_empty::emptyValidation,format_default);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ninx::lexer::token::Text::is_empty() {
    // Check if the text is empty or contain only spaces
    if (this->text.length() == 0) {
        return true;
    }

    if (valid_newline) {
        return false;
    }

    static const boost::regex emptyValidation("^[\\s]+$");
    return regex_match(this->get_text(), emptyValidation);
}